

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_group_scrolled_offset_begin
              (nk_context *ctx,nk_uint *x_offset,nk_uint *y_offset,char *title,nk_flags flags)

{
  float fVar1;
  uint uVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  nk_page_element *ptr;
  nk_rect bounds;
  nk_window panel;
  nk_rect local_1e8;
  nk_window local_1d8;
  
  pnVar3 = ctx->current;
  nk_panel_alloc_space(&local_1e8,ctx);
  pnVar4 = pnVar3->layout;
  fVar1 = (pnVar4->clip).x;
  if ((((pnVar4->clip).w + fVar1 < local_1e8.x) || (local_1e8.x + local_1e8.w < fVar1)) ||
     (fVar1 = (pnVar4->clip).y, (pnVar4->clip).h + fVar1 < local_1e8.y)) {
    if ((flags & 2) != 0) goto LAB_00135cdc;
  }
  else if (((flags & 2) != 0) || (fVar1 <= local_1e8.y + local_1e8.h)) {
LAB_00135cdc:
    uVar2 = pnVar3->flags;
    memset(&local_1d8,0,0x1a8);
    local_1d8.scrollbar.x = *x_offset;
    local_1d8.scrollbar.y = *y_offset;
    local_1d8.buffer.base = (pnVar3->buffer).base;
    local_1d8.buffer.clip.x = (pnVar3->buffer).clip.x;
    local_1d8.buffer.clip.y = (pnVar3->buffer).clip.y;
    local_1d8.buffer.clip.w = (pnVar3->buffer).clip.w;
    local_1d8.buffer.clip.h = (pnVar3->buffer).clip.h;
    local_1d8.buffer.use_clipping = (pnVar3->buffer).use_clipping;
    local_1d8.buffer._28_4_ = *(undefined4 *)&(pnVar3->buffer).field_0x1c;
    local_1d8.buffer.userdata = (pnVar3->buffer).userdata;
    local_1d8.buffer.begin = (pnVar3->buffer).begin;
    local_1d8.buffer.end = (pnVar3->buffer).end;
    local_1d8.buffer.last = (pnVar3->buffer).last;
    local_1d8.flags = uVar2 & 0x800 | flags;
    ptr = nk_create_page_element(ctx);
    nk_zero(ptr,0x1d0);
    ctx->current = &local_1d8;
    if ((flags & 0x40) == 0) {
      title = (char *)0x0;
    }
    local_1d8.layout = (nk_panel *)ptr;
    nk_panel_begin(ctx,title,NK_PANEL_GROUP);
    (pnVar3->buffer).base = local_1d8.buffer.base;
    (pnVar3->buffer).clip.x = local_1d8.buffer.clip.x;
    (pnVar3->buffer).clip.y = local_1d8.buffer.clip.y;
    (pnVar3->buffer).clip.w = local_1d8.buffer.clip.w;
    (pnVar3->buffer).clip.h = local_1d8.buffer.clip.h;
    (pnVar3->buffer).use_clipping = local_1d8.buffer.use_clipping;
    *(undefined4 *)&(pnVar3->buffer).field_0x1c = local_1d8.buffer._28_4_;
    (pnVar3->buffer).userdata = local_1d8.buffer.userdata;
    (pnVar3->buffer).begin = local_1d8.buffer.begin;
    (pnVar3->buffer).end = local_1d8.buffer.end;
    (pnVar3->buffer).last = local_1d8.buffer.last;
    uVar5 = *(undefined8 *)((long)&(local_1d8.layout)->type + 0x44);
    uVar6 = *(undefined8 *)((long)&(local_1d8.layout)->type + 0x4c);
    (pnVar3->buffer).clip.x = (float)(int)uVar5;
    (pnVar3->buffer).clip.y = (float)(int)((ulong)uVar5 >> 0x20);
    (pnVar3->buffer).clip.w = (float)(int)uVar6;
    (pnVar3->buffer).clip.h = (float)(int)((ulong)uVar6 >> 0x20);
    (((nk_page_data *)&(local_1d8.layout)->type)->pan).offset_x = x_offset;
    (((nk_page_data *)&(local_1d8.layout)->type)->pan).offset_y = y_offset;
    (((nk_page_data *)&(local_1d8.layout)->type)->pan).parent = pnVar3->layout;
    pnVar3->layout = local_1d8.layout;
    ctx->current = pnVar3;
    return 1;
  }
  return 0;
}

Assistant:

NK_API int
nk_group_scrolled_offset_begin(struct nk_context *ctx,
    nk_uint *x_offset, nk_uint *y_offset, const char *title, nk_flags flags)
{
    struct nk_rect bounds;
    struct nk_window panel;
    struct nk_window *win;

    win = ctx->current;
    nk_panel_alloc_space(&bounds, ctx);

    {const struct nk_rect *c = &win->layout->clip;
    if (!NK_INTERSECT(c->x, c->y, c->w, c->h, bounds.x, bounds.y, bounds.w, bounds.h) &&
        !(flags & NK_WINDOW_MOVABLE)) {
        return 0;
    }}
    if (win->flags & NK_WINDOW_ROM)
        flags |= NK_WINDOW_ROM;

    /* initialize a fake window to create the layout from */
    nk_zero(&panel, sizeof(panel));
    panel.bounds = bounds;
    panel.flags = flags;
    panel.scrollbar.x = *x_offset;
    panel.scrollbar.y = *y_offset;
    panel.buffer = win->buffer;
    panel.layout = (struct nk_panel*)nk_create_panel(ctx);
    ctx->current = &panel;
    nk_panel_begin(ctx, (flags & NK_WINDOW_TITLE) ? title: 0, NK_PANEL_GROUP);

    win->buffer = panel.buffer;
    win->buffer.clip = panel.layout->clip;
    panel.layout->offset_x = x_offset;
    panel.layout->offset_y = y_offset;
    panel.layout->parent = win->layout;
    win->layout = panel.layout;
    ctx->current = win;
    return 1;

}